

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall
dgMeshEffect::BuildFromVertexListIndexList
          (dgMeshEffect *this,HaI32 faceCount,HaI32 *faceIndexCount,HaI32 *faceMaterialIndex,
          HaF32 *vertex,HaI32 vertexStrideInBytes,HaI32 *vertexIndex,HaF32 *normal,
          HaI32 normalStrideInBytes,HaI32 *normalIndex,HaF32 *uv0,HaI32 uv0StrideInBytes,
          HaI32 *uv0Index,HaF32 *uv1,HaI32 uv1StrideInBytes,HaI32 *uv1Index)

{
  dgBigVector *pdVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  dgVertexAtribute *vertList;
  HaI32 HVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  dgEdge *pdVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  dgStack<signed_char> faceMark;
  dgStack<int> attrIndexMap;
  HaI64 userdata [256];
  HaI32 index [256];
  
  BeginPolygon(this);
  uVar21 = 0;
  iVar14 = 0;
  uVar7 = (ulong)(uint)(~(faceCount >> 0x1f) & faceCount);
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    uVar3 = faceIndexCount[uVar8];
    for (uVar20 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar20; uVar20 = uVar20 + 1) {
      if ((int)uVar21 < (int)(vertexIndex[(long)iVar14 + uVar20] + 1U)) {
        uVar21 = vertexIndex[(long)iVar14 + uVar20] + 1U;
      }
    }
    iVar14 = iVar14 + uVar3;
  }
  iVar14 = 0;
  uVar20 = (ulong)(~((int)uVar21 >> 0x1f) & uVar21);
  pfVar18 = (float *)(vertex + 3);
  uVar8 = uVar20;
  while (bVar22 = uVar8 != 0, uVar8 = uVar8 - 1, bVar22) {
    dgBigVector::dgBigVector
              ((dgBigVector *)userdata,(HaF64)(double)pfVar18[-3],(HaF64)(double)pfVar18[-2],
               (HaF64)(double)pfVar18[-1],(HaF64)(double)*pfVar18);
    AddVertex(this,(dgBigVector *)userdata);
    fVar2 = *pfVar18;
    pfVar18 = pfVar18 + (vertexStrideInBytes >> 2);
    iVar14 = iVar14 + (uint)((float)iVar14 < fVar2);
  }
  iVar17 = 0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    uVar3 = faceIndexCount[uVar8];
    iVar4 = faceMaterialIndex[uVar8];
    for (uVar19 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar19; uVar19 = uVar19 + 1) {
      pdVar1 = this->m_points + vertexIndex[(long)iVar17 + uVar19];
      userdata[0] = (HaI64)(pdVar1->super_dgTemplateVector<double>).m_x;
      userdata[1] = (HaI64)(pdVar1->super_dgTemplateVector<double>).m_y;
      userdata[2] = (HaI64)(pdVar1->super_dgTemplateVector<double>).m_z;
      userdata[3] = (HaI64)(pdVar1->super_dgTemplateVector<double>).m_w;
      lVar9 = (long)normalIndex[(long)iVar17 + uVar19] * (long)(normalStrideInBytes >> 2);
      lVar16 = (long)uv0Index[(long)iVar17 + uVar19] * (long)(uv0StrideInBytes >> 2);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(normal + lVar9 + 1);
      auVar24 = vpermt2ps_avx512vl(auVar24,_DAT_00f48910,ZEXT416((uint)normal[lVar9]));
      auVar24 = vinsertps_avx(auVar24,ZEXT416((uint)uv0[lVar16]),0x30);
      userdata._32_32_ = vcvtps2pd_avx(auVar24);
      lVar9 = (long)uv1Index[(long)iVar17 + uVar19] * (long)(uv1StrideInBytes >> 2);
      auVar24 = vinsertps_avx(ZEXT416((uint)uv0[lVar16 + 1]),ZEXT416((uint)uv1[lVar9]),0x10);
      userdata._64_16_ = vcvtps2pd_avx(auVar24);
      userdata[10] = (HaI64)(double)(float)uv1[lVar9 + 1];
      userdata[0xb] = (HaI64)(double)iVar4;
      AddAtribute(this,(dgVertexAtribute *)userdata);
    }
    iVar17 = iVar17 + uVar3;
  }
  dgStack<int>::dgStack(&attrIndexMap,this->m_atribCount);
  vertList = this->m_attib;
  HVar5 = this->m_atribCount;
  piVar10 = dgStack<int>::operator[](&attrIndexMap,0);
  HVar5 = dgVertexListToIndexList((HaF64 *)vertList,0x60,0xc,HVar5,piVar10,0.0);
  this->m_atribCount = HVar5;
  dgStack<signed_char>::dgStack(&faceMark,faceCount);
  pcVar11 = dgStack<signed_char>::operator[](&faceMark,0);
  memset(pcVar11,1,(long)faceMark.m_size);
  bVar22 = true;
  iVar17 = 0;
  do {
    do {
      if (!bVar22) {
        dgPolyhedra::EndFace(&this->super_dgPolyhedra);
        PackVertexArrays(this);
        free(faceMark.super_dgStackBase.m_ptr);
        free(attrIndexMap.super_dgStackBase.m_ptr);
        return;
      }
      bVar22 = false;
      iVar4 = 0;
      for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
        uVar3 = faceIndexCount[uVar8];
        if (0xff < (int)uVar3) {
          __assert_fail("indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0]))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                        ,0x4ed,
                        "void dgMeshEffect::BuildFromVertexListIndexList(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const, const hacd::HaF32 *const, hacd::HaI32, const hacd::HaI32 *const)"
                       );
        }
        pcVar11 = dgStack<signed_char>::operator[](&faceMark,(HaI32)uVar8);
        bVar23 = bVar22;
        if (*pcVar11 != '\0') {
          for (uVar19 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar19; uVar19 = uVar19 + 1) {
            index[uVar19] = vertexIndex[(long)iVar4 + uVar19] + iVar17 * uVar21;
            piVar10 = dgStack<int>::operator[](&attrIndexMap,iVar4 + (int)uVar19);
            userdata[uVar19] = (long)*piVar10;
          }
          pdVar12 = dgPolyhedra::AddFace(&this->super_dgPolyhedra,uVar3,index,userdata);
          if (pdVar12 == (dgEdge *)0x0) {
            uVar6 = 1;
            if (1 < (int)uVar3) {
              uVar6 = uVar3;
            }
            lVar9 = 1;
            bVar13 = false;
            uVar19 = 0;
            while (uVar19 != uVar6 - 1) {
              for (lVar16 = lVar9; (int)lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
                bVar13 = (bool)(bVar13 | index[uVar19] == index[lVar16]);
              }
              lVar9 = lVar9 + 1;
              uVar19 = uVar19 + 1;
            }
            bVar23 = true;
            if (!bVar13) goto LAB_00daaae4;
          }
          pcVar11 = dgStack<signed_char>::operator[](&faceMark,(HaI32)uVar8);
          *pcVar11 = '\0';
          bVar23 = bVar22;
        }
LAB_00daaae4:
        bVar22 = bVar23;
        iVar4 = iVar4 + uVar3;
      }
    } while (!bVar22);
    iVar15 = iVar17 + 1;
    iVar4 = iVar17 + 1;
    pfVar18 = (float *)(vertex + 2);
    uVar8 = uVar20;
    while (bVar23 = uVar8 != 0, uVar8 = uVar8 - 1, iVar17 = iVar15, bVar23) {
      dgBigVector::dgBigVector
                ((dgBigVector *)userdata,(HaF64)(double)pfVar18[-2],(HaF64)(double)pfVar18[-1],
                 (HaF64)(double)*pfVar18,(HaF64)(double)(iVar4 + iVar14));
      AddVertex(this,(dgBigVector *)userdata);
      pfVar18 = pfVar18 + (vertexStrideInBytes >> 2);
    }
  } while( true );
}

Assistant:

void dgMeshEffect::BuildFromVertexListIndexList(
	hacd::HaI32 faceCount, const hacd::HaI32* const faceIndexCount, const hacd::HaI32* const faceMaterialIndex, 
	const hacd::HaF32* const vertex, hacd::HaI32 vertexStrideInBytes, const hacd::HaI32* const vertexIndex,
	const hacd::HaF32* const normal, hacd::HaI32  normalStrideInBytes, const hacd::HaI32* const normalIndex,
	const hacd::HaF32* const uv0, hacd::HaI32  uv0StrideInBytes, const hacd::HaI32* const uv0Index,
	const hacd::HaF32* const uv1, hacd::HaI32  uv1StrideInBytes, const hacd::HaI32* const uv1Index)
{
	BeginPolygon ();

	// calculate vertex Count
	hacd::HaI32 acc = 0;
	hacd::HaI32 vertexCount = 0;
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		int count = faceIndexCount[j];
		for (int i = 0; i < count; i ++) {
			vertexCount = GetMax(vertexCount, vertexIndex[acc + i] + 1);
		}
		acc += count;
	}
		
	hacd::HaI32 layerCountBase = 0;
	hacd::HaI32 vertexStride = hacd::HaI32 (vertexStrideInBytes / sizeof (hacd::HaF32));
	for (int i = 0; i < vertexCount; i ++) {
		int index = i * vertexStride;
		AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], vertex[index + 3]));
		layerCountBase += (vertex[index + 3]) > hacd::HaF32(layerCountBase);
	}


	acc = 0;
	hacd::HaI32 normalStride = hacd::HaI32 (normalStrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv0Stride = hacd::HaI32 (uv0StrideInBytes / sizeof (hacd::HaF32));
	hacd::HaI32 uv1Stride = hacd::HaI32 (uv1StrideInBytes / sizeof (hacd::HaF32));
	for (hacd::HaI32 j = 0; j < faceCount; j ++) {
		hacd::HaI32 indexCount = faceIndexCount[j];
		hacd::HaI32 materialIndex = faceMaterialIndex[j];
		for (hacd::HaI32 i = 0; i < indexCount; i ++) {
			dgVertexAtribute point;
			hacd::HaI32 index = vertexIndex[acc + i];
			point.m_vertex = m_points[index];
			
			index = normalIndex[(acc + i)] * normalStride;
			point.m_normal_x =  normal[index + 0];
			point.m_normal_y =  normal[index + 1];
			point.m_normal_z =  normal[index + 2];

			index = uv0Index[(acc + i)] * uv0Stride;
			point.m_u0 = uv0[index + 0];
			point.m_v0 = uv0[index + 1];
			
			index = uv1Index[(acc + i)] * uv1Stride;
			point.m_u1 = uv1[index + 0];
			point.m_v1 = uv1[index + 1];

			point.m_material = materialIndex;
			AddAtribute(point);
		}
		acc += indexCount;
	}


	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute) / sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], DG_VERTEXLIST_INDEXLIST_TOL);

	bool hasFaces = true;
	dgStack<hacd::HaI8> faceMark (faceCount);
	memset (&faceMark[0], 1, size_t (faceMark.GetSizeInBytes()));
	
	hacd::HaI32 layerCount = 0;
	while (hasFaces) {
		acc = 0;
		hasFaces = false;
		hacd::HaI32 vertexBank = layerCount * vertexCount;
		for (hacd::HaI32 j = 0; j < faceCount; j ++) {
			hacd::HaI32 index[256];
			hacd::HaI64 userdata[256];

			int indexCount = faceIndexCount[j];
			HACD_ASSERT (indexCount < hacd::HaI32 (sizeof (index) / sizeof (index[0])));

			if (faceMark[j]) {
				for (int i = 0; i < indexCount; i ++) {
					index[i] = vertexIndex[acc + i] + vertexBank;
					userdata[i] = attrIndexMap[acc + i];
				}
				dgEdge* const edge = AddFace (indexCount, index, userdata);
				if (edge) {
					faceMark[j] = 0;
				} else {
					// check if the face is not degenerated
					bool degeneratedFace = false;
					for (int i = 0; i < indexCount - 1; i ++) {
						for (int k = i + 1; k < indexCount; k ++) {
							if (index[i] == index[k]) {
								degeneratedFace = true;		
							}
						}
					}
					if (degeneratedFace) {
						faceMark[j] = 0;
					} else {
						hasFaces = true;
					}
				}
			}
			acc += indexCount;
		}
		if (hasFaces) {
			layerCount ++;
			for (int i = 0; i < vertexCount; i ++) {
				int index = i * vertexStride;
				AddVertex (dgBigVector (vertex[index + 0], vertex[index + 1], vertex[index + 2], hacd::HaF64 (layerCount + layerCountBase)));
			}
		}
	}

	EndFace();
	PackVertexArrays ();
//	RepairTJoints (true);
}